

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O0

_Bool openjtalk_speakToFileU16(OpenJTalk *oj,char16_t *text,char16_t *file)

{
  byte bVar1;
  size_t sVar2;
  char *pcVar3;
  FILE *__stream;
  OpenJTalk *oj_00;
  char16_t *in_RDX;
  char16_t *in_RSI;
  long in_RDI;
  _Bool result;
  char *buf;
  FILE *wavfp;
  char pathU8 [260];
  FILE *in_stack_fffffffffffffeb8;
  undefined7 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec7;
  char local_128 [272];
  char16_t *local_18;
  long local_10;
  
  if (in_RDI == 0) {
    g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
  }
  else {
    *(undefined4 *)(in_RDI + 0x678) = 0;
    if ((in_RDX == (char16_t *)0x0) || (in_RSI == (char16_t *)0x0)) {
      *(undefined4 *)(in_RDI + 0x678) = 2;
    }
    else {
      local_18 = in_RSI;
      local_10 = in_RDI;
      sVar2 = strlenU16(in_RDX);
      if ((sVar2 != 0) && (sVar2 = strlenU16(local_18), sVar2 != 0)) {
        pcVar3 = u16tou8_path((char16_t *)
                              CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
                              (char *)in_stack_fffffffffffffeb8);
        if (pcVar3 == (char *)0x0) {
          return false;
        }
        __stream = fopen(local_128,"wb");
        if (__stream == (FILE *)0x0) {
          *(undefined4 *)(local_10 + 0x678) = 8;
          return false;
        }
        oj_00 = (OpenJTalk *)u16tou8((char16_t *)0x19d64c);
        if (oj_00 == (OpenJTalk *)0x0) {
          return false;
        }
        bVar1 = generate_wavFile(oj_00,(char *)CONCAT17(in_stack_fffffffffffffec7,
                                                        in_stack_fffffffffffffec0),
                                 in_stack_fffffffffffffeb8);
        if (oj_00 != (OpenJTalk *)0x0) {
          free(oj_00);
        }
        fclose(__stream);
        return (_Bool)(bVar1 & 1);
      }
      *(undefined4 *)(local_10 + 0x678) = 2;
    }
  }
  return false;
}

Assistant:

OPENJTALK_CONVENTION openjtalk_speakToFileU16(OpenJTalk *oj, const char16_t *text, const char16_t *file)
{
	if (!oj)
	{
		g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
		return false;
	}
	oj->errorCode = OPENJTALKERROR_NO_ERROR;
	if (file == NULL || text == NULL)
	{
		oj->errorCode = OPENJTALKERROR_STRING_IS_NULL_OR_EMPTY;
		return false;
	}
	if (strlenU16(file) == 0 || strlenU16(text) == 0)
	{
		oj->errorCode = OPENJTALKERROR_STRING_IS_NULL_OR_EMPTY;
		return false;
	}
#if defined(_WIN32) && !defined(__CYGWIN__) && !defined(__MINGW32__)
	FILE *wavfp = _wfopen((wchar_t *)file, u"wb");
#else
	char pathU8[MAX_PATH];
	if (!u16tou8_path(file, pathU8))
	{
		return false;
	}
	FILE *wavfp = fopen(pathU8, "wb");
#endif
	if (!wavfp)
	{
		oj->errorCode = OPENJTALKERROR_FILE_OPEN_ERROR;
		return false;
	}
	char *buf = u16tou8(text);
	if (!buf)
	{
		return false;
	}
	bool result = generate_wavFile(oj, buf, wavfp);
	if (buf)
	{
		free(buf);
	}
	fclose(wavfp);
	return result;
}